

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O0

void lws_sul_http_ah_lifecheck(lws_sorted_usec_list_t *sul)

{
  lws *wsi_00;
  int iVar1;
  time_t tVar2;
  uchar *puVar3;
  uchar *c;
  char buf [256];
  int len;
  int m;
  time_t now;
  lws *wsi;
  lws_context_per_thread *pt;
  allocated_headers *ah;
  lws_sorted_usec_list_t *sul_local;
  
  tVar2 = time((time_t *)0x0);
  pt = (lws_context_per_thread *)sul[5].list.prev;
  while (pt != (lws_context_per_thread *)0x0) {
    if ((((*(char *)((long)&pt[2].sul_tls.list.prev + 2) == '\0') ||
         ((pt->dll_buflist_owner).head == (lws_dll2 *)0x0)) ||
        (pt[2].dll_buflist_owner.head == (lws_dll2 *)0x0)) ||
       (((pt->dll_buflist_owner).head[0x15].next != (lws_dll2 *)0x0 &&
        (tVar2 - (long)pt[2].dll_buflist_owner.head <
         (long)(*(int *)((long)&(pt->dll_buflist_owner).head[0x15].next[0x1c].next + 4) + 0x168)))))
    {
      pt = (lws_context_per_thread *)(pt->dll_buflist_owner).tail;
    }
    else {
      wsi_00 = (lws *)(pt->dll_buflist_owner).head;
      c._0_1_ = 0;
      lws_get_peer_simple(wsi_00,(char *)&c,0x100);
      _lws_log(4,"ah excessive hold: wsi %p\n  peer address: %s\n  ah pos %lu\n",wsi_00,&c,
               (ulong)*(uint *)((long)&pt[2].sul_ah_lifecheck.list.next + 4));
      c._0_1_ = 0;
      buf[0xfc] = '\0';
      buf[0xfd] = '\0';
      buf[0xfe] = '\0';
      buf[0xff] = '\0';
      while ((puVar3 = lws_token_to_string(buf._252_4_), puVar3 != (uchar *)0x0 && (*puVar3 != '\0')
             )) {
        buf._248_4_ = lws_hdr_total_length(wsi_00,buf._252_4_);
        if ((buf._248_4_ != 0) &&
           (((int)buf._248_4_ < 0x100 &&
            (iVar1 = lws_hdr_copy(wsi_00,(char *)&c,0x100,buf._252_4_), 0 < iVar1)))) {
          buf[0xf7] = '\0';
          _lws_log(4,"   %s = %s\n",puVar3,&c);
        }
        buf._252_4_ = buf._252_4_ + 1;
      }
      lws_header_table_detach(wsi_00,0);
      __lws_close_free_wsi(wsi_00,LWS_CLOSE_STATUS_NOSTATUS,"excessive ah");
      pt = (lws_context_per_thread *)sul[5].list.prev;
    }
  }
  return;
}

Assistant:

void
lws_sul_http_ah_lifecheck(lws_sorted_usec_list_t *sul)
{
	struct allocated_headers *ah;
	struct lws_context_per_thread *pt = lws_container_of(sul,
			struct lws_context_per_thread, sul_ah_lifecheck);
	struct lws *wsi;
	time_t now;
	int m;

	now = time(NULL);

	lws_pt_lock(pt, __func__);

	ah = pt->http.ah_list;
	while (ah) {
		int len;
		char buf[256];
		const unsigned char *c;

		if (!ah->in_use || !ah->wsi || !ah->assigned ||
		    (ah->wsi->vhost &&
		     (now - ah->assigned) <
		     ah->wsi->vhost->timeout_secs_ah_idle + 360)) {
			ah = ah->next;
			continue;
		}

		/*
		 * a single ah session somehow got held for
		 * an unreasonable amount of time.
		 *
		 * Dump info on the connection...
		 */
		wsi = ah->wsi;
		buf[0] = '\0';
#if !defined(LWS_PLAT_OPTEE)
		lws_get_peer_simple(wsi, buf, sizeof(buf));
#else
		buf[0] = '\0';
#endif
		lwsl_notice("ah excessive hold: wsi %p\n"
			    "  peer address: %s\n"
			    "  ah pos %lu\n",
			    wsi, buf, (unsigned long)ah->pos);
		buf[0] = '\0';
		m = 0;
		do {
			c = lws_token_to_string(m);
			if (!c)
				break;
			if (!(*c))
				break;

			len = lws_hdr_total_length(wsi, m);
			if (!len || len > (int)sizeof(buf) - 1) {
				m++;
				continue;
			}

			if (lws_hdr_copy(wsi, buf, sizeof buf, m) > 0) {
				buf[sizeof(buf) - 1] = '\0';

				lwsl_notice("   %s = %s\n",
					    (const char *)c, buf);
			}
			m++;
		} while (1);

		/* explicitly detach the ah */
		lws_header_table_detach(wsi, 0);

		/* ... and then drop the connection */

		__lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					     "excessive ah");

		ah = pt->http.ah_list;
	}

	lws_pt_unlock(pt);
}